

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O1

SizeT SPARC_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  uint uVar1;
  int iVar2;
  SizeT in_RAX;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  if (3 < size) {
    in_RAX = 3;
    iVar3 = 0;
    iVar4 = 0;
    do {
      if (data[in_RAX - 3] == '\x7f') {
        if (0xbf < data[in_RAX - 2]) goto LAB_00112798;
      }
      else if ((data[in_RAX - 3] == '@') && (data[in_RAX - 2] < 0x40)) {
LAB_00112798:
        uVar5 = (uint)data[in_RAX] | (uint)data[in_RAX - 1] << 8 | (uint)data[in_RAX - 2] << 0x10;
        uVar1 = iVar4 + uVar5 * 4;
        uVar6 = uVar1 >> 2;
        uVar5 = (int)(uVar5 * 0x200 + iVar3) >> 9 & 0x3fc00000;
        data[in_RAX - 3] = (byte)(uVar5 >> 0x18) | 0x40;
        data[in_RAX - 2] = (byte)(uVar6 >> 0x10) & 0x3f | (byte)(uVar5 >> 0x10);
        data[in_RAX - 1] = (Byte)(uVar1 >> 10);
        data[in_RAX] = (Byte)uVar6;
      }
      iVar2 = (int)in_RAX;
      in_RAX = in_RAX + 4;
      iVar4 = iVar4 + -4;
      iVar3 = iVar3 + -0x200;
    } while ((ulong)(iVar2 + 1) <= size - 4);
  }
  return in_RAX;
}

Assistant:

static SizeT SPARC_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  UInt32 i;
  if (size < 4)
    return 0;
  size -= 4;
  for (i = 0; i <= size; i += 4)
  {
    if ((data[i] == 0x40 && (data[i + 1] & 0xC0) == 0x00) ||
        (data[i] == 0x7F && (data[i + 1] & 0xC0) == 0xC0))
    {
      UInt32 src =
        ((UInt32)data[i + 0] << 24) |
        ((UInt32)data[i + 1] << 16) |
        ((UInt32)data[i + 2] << 8) |
        ((UInt32)data[i + 3]);
      UInt32 dest;
      
      src <<= 2;
      if (encoding)
        dest = ip + i + src;
      else
        dest = src - (ip + i);
      dest >>= 2;
      
      dest = (((0 - ((dest >> 22) & 1)) << 22) & 0x3FFFFFFF) | (dest & 0x3FFFFF) | 0x40000000;

      data[i + 0] = (Byte)(dest >> 24);
      data[i + 1] = (Byte)(dest >> 16);
      data[i + 2] = (Byte)(dest >> 8);
      data[i + 3] = (Byte)dest;
    }
  }
  return i;
}